

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_manager.cpp
# Opt level: O0

bool __thiscall miniros::ServiceManager::unadvertiseService(ServiceManager *this,string *serv_name)

{
  bool bVar1;
  __type_conflict _Var2;
  element_type *peVar3;
  string *__s;
  long in_RDI;
  bool enabled;
  iterator i;
  scoped_lock<std::mutex> lock;
  ServicePublicationPtr pub;
  scoped_lock<std::recursive_mutex> shutdown_lock;
  string *in_stack_00000430;
  ServiceManager *in_stack_00000438;
  mutex_type *in_stack_ffffffffffffff08;
  ServicePublication *in_stack_ffffffffffffff10;
  const_iterator in_stack_ffffffffffffff18;
  LogLocation *in_stack_ffffffffffffff20;
  void *logger_handle;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  Level LVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  Level level;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  LogLocation *loc;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  LogLocation local_91 [2];
  _List_node_base *local_70;
  _List_const_iterator<std::shared_ptr<miniros::ServicePublication>_> local_68;
  _Self local_60;
  _Self local_58 [4];
  __shared_ptr local_38 [20];
  undefined4 local_24;
  byte local_1;
  
  std::scoped_lock<std::recursive_mutex>::scoped_lock
            ((scoped_lock<std::recursive_mutex> *)in_stack_ffffffffffffff10,
             (mutex_type *)in_stack_ffffffffffffff08);
  if ((*(byte *)(in_RDI + 0x80) & 1) == 0) {
    std::shared_ptr<miniros::ServicePublication>::shared_ptr
              ((shared_ptr<miniros::ServicePublication> *)0x4ae8bc);
    std::scoped_lock<std::mutex>::scoped_lock
              ((scoped_lock<std::mutex> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    local_58[0]._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
         ::begin((list<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
                  *)in_stack_ffffffffffffff08);
    while( true ) {
      local_60._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
           ::end((list<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
                  *)in_stack_ffffffffffffff08);
      bVar1 = std::operator!=(local_58,&local_60);
      if (!bVar1) break;
      std::_List_iterator<std::shared_ptr<miniros::ServicePublication>_>::operator*
                ((_List_iterator<std::shared_ptr<miniros::ServicePublication>_> *)0x4ae923);
      peVar3 = std::
               __shared_ptr_access<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x4ae92b);
      ServicePublication::getName_abi_cxx11_(peVar3);
      _Var2 = std::operator==(in_stack_ffffffffffffff30,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      if (_Var2) {
        std::_List_iterator<std::shared_ptr<miniros::ServicePublication>_>::operator*
                  ((_List_iterator<std::shared_ptr<miniros::ServicePublication>_> *)0x4ae962);
        peVar3 = std::
                 __shared_ptr_access<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x4ae96a);
        in_stack_ffffffffffffff57 = ServicePublication::isDropped(peVar3);
        if (!(bool)in_stack_ffffffffffffff57) {
          std::_List_iterator<std::shared_ptr<miniros::ServicePublication>_>::operator*
                    ((_List_iterator<std::shared_ptr<miniros::ServicePublication>_> *)0x4ae993);
          std::shared_ptr<miniros::ServicePublication>::operator=
                    ((shared_ptr<miniros::ServicePublication> *)in_stack_ffffffffffffff10,
                     (shared_ptr<miniros::ServicePublication> *)in_stack_ffffffffffffff08);
          std::_List_const_iterator<std::shared_ptr<miniros::ServicePublication>_>::
          _List_const_iterator(&local_68,local_58);
          local_70 = (_List_node_base *)
                     std::__cxx11::
                     list<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
                     ::erase((list<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
                              *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff18);
          break;
        }
      }
      std::_List_iterator<std::shared_ptr<miniros::ServicePublication>_>::operator++(local_58);
    }
    LVar4 = (Level)((ulong)in_stack_ffffffffffffff08 >> 0x20);
    level = (Level)((ulong)in_stack_ffffffffffffff30 >> 0x20);
    std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4aea34);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_38);
    if (bVar1) {
      peVar3 = std::
               __shared_ptr_access<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x4aea57);
      __s = ServicePublication::getName_abi_cxx11_(peVar3);
      unregisterService(in_stack_00000438,in_stack_00000430);
      if (((console::g_initialized ^ 0xff) & 1) != 0) {
        console::initialize();
      }
      if (((unadvertiseService::loc.initialized_ ^ 0xffU) & 1) != 0) {
        loc = local_91;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),(char *)__s,
                   (allocator<char> *)loc);
        console::initializeLogLocation
                  (loc,(string *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),level
                  );
        std::__cxx11::string::~string((string *)&local_91[0].logger_enabled_);
        std::allocator<char>::~allocator((allocator<char> *)local_91);
      }
      if (unadvertiseService::loc.level_ != Debug) {
        console::setLogLocationLevel((LogLocation *)in_stack_ffffffffffffff10,LVar4);
        console::checkLogLocationEnabled(in_stack_ffffffffffffff20);
      }
      if ((unadvertiseService::loc.logger_enabled_ & 1U) != 0) {
        logger_handle = unadvertiseService::loc.logger_;
        LVar4 = unadvertiseService::loc.level_;
        peVar3 = std::
                 __shared_ptr_access<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x4aebb3);
        ServicePublication::getName_abi_cxx11_(peVar3);
        in_stack_ffffffffffffff10 = (ServicePublication *)std::__cxx11::string::c_str();
        console::print((FilterBase *)0x0,logger_handle,(Level)(ulong)LVar4,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/service_manager.cpp"
                       ,0xb3,"bool miniros::ServiceManager::unadvertiseService(const string &)",
                       "shutting down service [%s]");
      }
      std::
      __shared_ptr_access<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x4aec1b);
      ServicePublication::drop(in_stack_ffffffffffffff10);
      local_1 = 1;
    }
    else {
      local_1 = 0;
    }
    local_24 = 1;
    std::shared_ptr<miniros::ServicePublication>::~shared_ptr
              ((shared_ptr<miniros::ServicePublication> *)0x4aec5a);
  }
  else {
    local_1 = 0;
    local_24 = 1;
  }
  std::scoped_lock<std::recursive_mutex>::~scoped_lock
            ((scoped_lock<std::recursive_mutex> *)0x4aec85);
  return (bool)(local_1 & 1);
}

Assistant:

bool ServiceManager::unadvertiseService(const string &serv_name)
{
  std::scoped_lock<std::recursive_mutex> shutdown_lock(shutting_down_mutex_);
  if (shutting_down_)
  {
    return false;
  }

  ServicePublicationPtr pub;
  {
    std::scoped_lock<std::mutex> lock(service_publications_mutex_);

    for (auto i = service_publications_.begin(); i != service_publications_.end(); ++i)
    {
      if((*i)->getName() == serv_name && !(*i)->isDropped())
      {
        pub = *i;
        service_publications_.erase(i);
        break;
      }
    }
  }

  if (pub)
  {
    unregisterService(pub->getName());
    MINIROS_DEBUG( "shutting down service [%s]", pub->getName().c_str());
    pub->drop();
    return true;
  }

  return false;
}